

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.c
# Opt level: O3

uint prvTidytidyErrorCodeFromKey(ctmbstr code)

{
  uint uVar1;
  int iVar2;
  uint uVar3;
  tidyStringsKeyItem *ptVar4;
  
  iVar2 = strcmp("TidyDiagnostics",code);
  if (iVar2 == 0) {
    ptVar4 = tidyStringsKeys;
  }
  else {
    uVar1 = 1;
    do {
      uVar3 = uVar1;
      if (tidyStringsKeys[uVar3].key == (char *)0x0) {
        return 0xffffffff;
      }
      iVar2 = strcmp(tidyStringsKeys[uVar3].key,code);
      uVar1 = uVar3 + 1;
    } while (iVar2 != 0);
    ptVar4 = tidyStringsKeys + uVar3;
  }
  return ptVar4->value;
}

Assistant:

uint TY_(tidyErrorCodeFromKey)(ctmbstr code)
{
    uint i = 0;
    while (tidyStringsKeys[i].key) {
        if ( strcmp(tidyStringsKeys[i].key, code) == 0 )
            return tidyStringsKeys[i].value;
        i++;
    }
    return UINT_MAX;
}